

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP4Writer::Flush(BP4Writer *this,int transportIndex)

{
  _func_int *p_Var1;
  int iVar2;
  ScopedTimer __var2137;
  ScopedTimer local_18;
  
  if (Flush(int)::__var137 == '\0') {
    iVar2 = __cxa_guard_acquire(&Flush(int)::__var137);
    if (iVar2 != 0) {
      Flush::__var137 = (void *)ps_timer_create_("BP4Writer::Flush");
      __cxa_guard_release(&Flush(int)::__var137);
    }
  }
  local_18.m_timer = Flush::__var137;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  DoFlush(this,false,transportIndex);
  p_Var1 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3];
  adios2::format::BPBase::ResetBuffer
            ((BPBase *)(p_Var1 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
             (Buffer *)(p_Var1 + 0x30 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
             false,false);
  if (((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x239)
      [(long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base] == (_func_int)0x1) {
    WriteCollectiveMetadataFile(this,false);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_18);
  return;
}

Assistant:

void BP4Writer::Flush(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Writer::Flush");
    DoFlush(false, transportIndex);
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_Data, false, false);

    if (m_BP4Serializer.m_Parameters.CollectiveMetadata)
    {
        WriteCollectiveMetadataFile();
    }
}